

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::alphaHullInstruction(SelectionEvaluator *this,Token *instruction)

{
  bool bVar1;
  int iVar2;
  SelectionEvaluator *in_RSI;
  allocator<char> *in_RDI;
  RealType RVar3;
  float alpha;
  any alphaSpec;
  SelectionSet bs;
  string *in_stack_ffffffffffffff28;
  SelectionEvaluator *in_stack_ffffffffffffff30;
  any *in_stack_ffffffffffffff38;
  any *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  HullFinder *in_stack_ffffffffffffff78;
  allocator<char> local_71;
  string local_70 [32];
  float local_50;
  
  createSelectionSets(in_RSI);
  std::any::any(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_50 = 0.0;
  std::any::type(in_stack_ffffffffffffff38);
  bVar1 = std::type_info::operator==
                    ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38);
  if (bVar1) {
    local_50 = std::any_cast<float>((any *)in_stack_ffffffffffffff30);
  }
  else {
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    if (bVar1) {
      iVar2 = std::any_cast<int>((any *)in_stack_ffffffffffffff30);
      local_50 = (float)iVar2;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,(char *)in_RSI,in_RDI);
      evalError(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
      SelectionSet::clearAll((SelectionSet *)in_stack_ffffffffffffff30);
    }
  }
  AlphaHullFinder::setAlpha(&in_RSI->alphaHullFinder,(double)local_50);
  HullFinder::findHull(in_stack_ffffffffffffff78);
  SelectionSet::operator=
            ((SelectionSet *)in_stack_ffffffffffffff30,(SelectionSet *)in_stack_ffffffffffffff28);
  SelectionSet::~SelectionSet((SelectionSet *)0x3cac30);
  RVar3 = HullFinder::getSurfaceArea(&(in_RSI->alphaHullFinder).super_HullFinder);
  in_RSI->surfaceArea_ = RVar3;
  in_RSI->hasSurfaceArea_ = true;
  RVar3 = HullFinder::getVolume(&(in_RSI->alphaHullFinder).super_HullFinder);
  in_RSI->volume_ = RVar3;
  in_RSI->hasVolume_ = true;
  SelectionSet::parallelReduce((SelectionSet *)in_stack_ffffffffffffff78);
  std::any::~any((any *)0x3cacb2);
  SelectionSet::~SelectionSet((SelectionSet *)0x3cacbf);
  return (SelectionSet *)in_RDI;
}

Assistant:

SelectionSet SelectionEvaluator::alphaHullInstruction(
      const Token& instruction) {
    SelectionSet bs = createSelectionSets();

    std::any alphaSpec = instruction.value;
    float alpha(0.0);
    if (alphaSpec.type() == typeid(float)) {
      alpha = std::any_cast<float>(alphaSpec);
    } else if (alphaSpec.type() == typeid(int)) {
      alpha = std::any_cast<int>(alphaSpec);
    } else {
      evalError("casting error in alphaHullInstruction");
      bs.clearAll();
    }

    alphaHullFinder.setAlpha(alpha);
    bs              = alphaHullFinder.findHull();
    surfaceArea_    = alphaHullFinder.getSurfaceArea();
    hasSurfaceArea_ = true;
    volume_         = alphaHullFinder.getVolume();
    hasVolume_      = true;

    return bs.parallelReduce();
  }